

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O0

void __thiscall
Apple::II::Video::VideoBase::output_double_low_resolution
          (VideoBase *this,uint8_t *target,uint8_t *source,uint8_t *auxiliary_source,size_t length,
          int column,int row)

{
  byte bVar1;
  byte bVar2;
  ulong local_40;
  size_t c;
  int row_shift;
  int column_local;
  size_t length_local;
  uint8_t *auxiliary_source_local;
  uint8_t *source_local;
  uint8_t *target_local;
  VideoBase *this_local;
  
  bVar1 = (byte)row & 4;
  source_local = target;
  for (local_40 = 0; local_40 < length; local_40 = local_40 + 1) {
    if ((column + (int)local_40 & 1U) == 0) {
      bVar2 = (byte)((int)(uint)auxiliary_source[local_40] >> bVar1) & 1;
      source_local[4] = bVar2;
      *source_local = bVar2;
      bVar2 = (byte)((int)(uint)auxiliary_source[local_40] >> bVar1) & 2;
      source_local[5] = bVar2;
      source_local[1] = bVar2;
      bVar2 = (byte)((int)(uint)auxiliary_source[local_40] >> bVar1) & 4;
      source_local[6] = bVar2;
      source_local[2] = bVar2;
      source_local[3] = (byte)((int)(uint)auxiliary_source[local_40] >> bVar1) & 8;
      bVar2 = (byte)((int)(uint)source[local_40] >> bVar1) & 2;
      source_local[0xc] = bVar2;
      source_local[8] = bVar2;
      bVar2 = (byte)((int)(uint)source[local_40] >> bVar1) & 4;
      source_local[0xd] = bVar2;
      source_local[9] = bVar2;
      source_local[10] = (byte)((int)(uint)source[local_40] >> bVar1) & 8;
      bVar2 = (byte)((int)(uint)source[local_40] >> bVar1) & 1;
      source_local[0xb] = bVar2;
      source_local[7] = bVar2;
      this->graphics_carry_ = (byte)((int)(uint)source[local_40] >> bVar1) & 2;
    }
    else {
      bVar2 = (byte)((int)(uint)auxiliary_source[local_40] >> bVar1) & 4;
      source_local[4] = bVar2;
      *source_local = bVar2;
      bVar2 = (byte)((int)(uint)auxiliary_source[local_40] >> bVar1) & 8;
      source_local[5] = bVar2;
      source_local[1] = bVar2;
      bVar2 = (byte)((int)(uint)auxiliary_source[local_40] >> bVar1) & 1;
      source_local[6] = bVar2;
      source_local[2] = bVar2;
      source_local[3] = (byte)((int)(uint)auxiliary_source[local_40] >> bVar1) & 2;
      bVar2 = (byte)((int)(uint)source[local_40] >> bVar1) & 8;
      source_local[0xc] = bVar2;
      source_local[8] = bVar2;
      bVar2 = (byte)((int)(uint)source[local_40] >> bVar1) & 1;
      source_local[0xd] = bVar2;
      source_local[9] = bVar2;
      source_local[10] = (byte)((int)(uint)source[local_40] >> bVar1) & 2;
      bVar2 = (byte)((int)(uint)source[local_40] >> bVar1) & 4;
      source_local[0xb] = bVar2;
      source_local[7] = bVar2;
      this->graphics_carry_ = (byte)((int)(uint)source[local_40] >> bVar1) & 8;
    }
    source_local = source_local + 0xe;
  }
  return;
}

Assistant:

void VideoBase::output_double_low_resolution(uint8_t *target, const uint8_t *const source, const uint8_t *const auxiliary_source, size_t length, int column, int row) const {
	const int row_shift = row&4;
	for(size_t c = 0; c < length; ++c) {
		if((column + int(c))&1) {
			target[0] = target[4] = (auxiliary_source[c] >> row_shift) & 4;
			target[1] = target[5] = (auxiliary_source[c] >> row_shift) & 8;
			target[2] = target[6] = (auxiliary_source[c] >> row_shift) & 1;
			target[3] = (auxiliary_source[c] >> row_shift) & 2;

			target[8] = target[12] = (source[c] >> row_shift) & 8;
			target[9] = target[13] = (source[c] >> row_shift) & 1;
			target[10] = (source[c] >> row_shift) & 2;
			target[7] = target[11] = (source[c] >> row_shift) & 4;
			graphics_carry_ = (source[c] >> row_shift) & 8;
		} else {
			target[0] = target[4] = (auxiliary_source[c] >> row_shift) & 1;
			target[1] = target[5] = (auxiliary_source[c] >> row_shift) & 2;
			target[2] = target[6] = (auxiliary_source[c] >> row_shift) & 4;
			target[3] = (auxiliary_source[c] >> row_shift) & 8;

			target[8] = target[12] = (source[c] >> row_shift) & 2;
			target[9] = target[13] = (source[c] >> row_shift) & 4;
			target[10] = (source[c] >> row_shift) & 8;
			target[7] = target[11] = (source[c] >> row_shift) & 1;
			graphics_carry_ = (source[c] >> row_shift) & 2;
		}
		target += 14;
	}
}